

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint getTreeInflateDynamic(HuffmanTree *tree_ll,HuffmanTree *tree_d,LodePNGBitReader *reader)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint replength_2;
  uint replength_1;
  uint value;
  uint replength;
  uint code;
  HuffmanTree tree_cl;
  uint *bitlen_cl;
  uint *bitlen_d;
  uint *bitlen_ll;
  uint i;
  uint HCLEN;
  uint HDIST;
  uint HLIT;
  uint n;
  uint error;
  LodePNGBitReader *reader_local;
  HuffmanTree *tree_d_local;
  HuffmanTree *tree_ll_local;
  
  bitlen_d = (uint *)0x0;
  bitlen_cl = (uint *)0x0;
  tree_cl.table_value = (unsigned_short *)0x0;
  uVar1 = ensureBits17(reader,0xe);
  if (uVar1 == 0) {
    tree_ll_local._4_4_ = 0x31;
  }
  else {
    uVar2 = readBits(reader,5);
    uVar3 = uVar2 + 0x101;
    uVar1 = readBits(reader,5);
    iVar4 = uVar1 + 1;
    uVar1 = readBits(reader,4);
    uVar1 = uVar1 + 4;
    tree_cl.table_value = (unsigned_short *)lodepng_malloc(0x4c);
    if (tree_cl.table_value == (unsigned_short *)0x0) {
      tree_ll_local._4_4_ = 0x53;
    }
    else {
      HuffmanTree_init((HuffmanTree *)&replength);
      iVar5 = lodepng_gtofl(reader->bp,(ulong)(uVar1 * 3),reader->bitsize);
      if (iVar5 == 0) {
        for (bitlen_ll._0_4_ = 0; (uint)bitlen_ll != uVar1; bitlen_ll._0_4_ = (uint)bitlen_ll + 1) {
          ensureBits9(reader,3);
          uVar6 = readBits(reader,3);
          *(uint *)(tree_cl.table_value + (ulong)CLCL_ORDER[(uint)bitlen_ll] * 2) = uVar6;
        }
        while (bitlen_ll._0_4_ = uVar1, (uint)bitlen_ll != 0x13) {
          uVar1 = CLCL_ORDER[(uint)bitlen_ll];
          (tree_cl.table_value + (ulong)uVar1 * 2)[0] = 0;
          (tree_cl.table_value + (ulong)uVar1 * 2)[1] = 0;
          uVar1 = (uint)bitlen_ll + 1;
        }
        HLIT = HuffmanTree_makeFromLengths
                         ((HuffmanTree *)&replength,(uint *)tree_cl.table_value,0x13,7);
        if (HLIT == 0) {
          bitlen_d = (uint *)lodepng_malloc(0x480);
          bitlen_cl = (uint *)lodepng_malloc(0x80);
          if ((bitlen_d == (uint *)0x0) || (bitlen_cl == (uint *)0x0)) {
            HLIT = 0x53;
          }
          else {
            lodepng_memset(bitlen_d,0,0x480);
            lodepng_memset(bitlen_cl,0,0x80);
            bitlen_ll._0_4_ = 0;
            do {
              if (uVar3 + iVar4 <= (uint)bitlen_ll) goto LAB_001343da;
              ensureBits25(reader,0x16);
              uVar1 = huffmanDecodeSymbol(reader,(HuffmanTree *)&replength);
              if (uVar1 < 0x10) {
                if ((uint)bitlen_ll < uVar3) {
                  bitlen_d[(uint)bitlen_ll] = uVar1;
                }
                else {
                  bitlen_cl[(uint)bitlen_ll - uVar3] = uVar1;
                }
                bitlen_ll._0_4_ = (uint)bitlen_ll + 1;
              }
              else if (uVar1 == 0x10) {
                if ((uint)bitlen_ll == 0) {
                  HLIT = 0x36;
                  goto LAB_001343da;
                }
                uVar1 = readBits(reader,2);
                if ((uint)bitlen_ll < uVar2 + 0x102) {
                  replength_2 = bitlen_d[(uint)bitlen_ll - 1];
                }
                else {
                  replength_2 = bitlen_cl[((uint)bitlen_ll - uVar3) - 1];
                }
                for (HDIST = 0; HDIST < uVar1 + 3; HDIST = HDIST + 1) {
                  if (uVar3 + iVar4 <= (uint)bitlen_ll) {
                    HLIT = 0xd;
                    break;
                  }
                  if ((uint)bitlen_ll < uVar3) {
                    bitlen_d[(uint)bitlen_ll] = replength_2;
                  }
                  else {
                    bitlen_cl[(uint)bitlen_ll - uVar3] = replength_2;
                  }
                  bitlen_ll._0_4_ = (uint)bitlen_ll + 1;
                }
              }
              else if (uVar1 == 0x11) {
                uVar1 = readBits(reader,3);
                for (HDIST = 0; HDIST < uVar1 + 3; HDIST = HDIST + 1) {
                  if (uVar3 + iVar4 <= (uint)bitlen_ll) {
                    HLIT = 0xe;
                    break;
                  }
                  if ((uint)bitlen_ll < uVar3) {
                    bitlen_d[(uint)bitlen_ll] = 0;
                  }
                  else {
                    bitlen_cl[(uint)bitlen_ll - uVar3] = 0;
                  }
                  bitlen_ll._0_4_ = (uint)bitlen_ll + 1;
                }
              }
              else {
                if (uVar1 != 0x12) {
                  HLIT = 0x10;
                  goto LAB_001343da;
                }
                uVar1 = readBits(reader,7);
                for (HDIST = 0; HDIST < uVar1 + 0xb; HDIST = HDIST + 1) {
                  if (uVar3 + iVar4 <= (uint)bitlen_ll) {
                    HLIT = 0xf;
                    break;
                  }
                  if ((uint)bitlen_ll < uVar3) {
                    bitlen_d[(uint)bitlen_ll] = 0;
                  }
                  else {
                    bitlen_cl[(uint)bitlen_ll - uVar3] = 0;
                  }
                  bitlen_ll._0_4_ = (uint)bitlen_ll + 1;
                }
              }
            } while (reader->bp <= reader->bitsize);
            HLIT = 0x32;
LAB_001343da:
            if (HLIT == 0) {
              if (bitlen_d[0x100] == 0) {
                HLIT = 0x40;
              }
              else {
                HLIT = HuffmanTree_makeFromLengths(tree_ll,bitlen_d,0x120,0xf);
                if (HLIT == 0) {
                  HLIT = HuffmanTree_makeFromLengths(tree_d,bitlen_cl,0x20,0xf);
                }
              }
            }
          }
        }
      }
      else {
        HLIT = 0x32;
      }
      lodepng_free(tree_cl.table_value);
      lodepng_free(bitlen_d);
      lodepng_free(bitlen_cl);
      HuffmanTree_cleanup((HuffmanTree *)&replength);
      tree_ll_local._4_4_ = HLIT;
    }
  }
  return tree_ll_local._4_4_;
}

Assistant:

static unsigned getTreeInflateDynamic(HuffmanTree* tree_ll, HuffmanTree* tree_d,
                                      LodePNGBitReader* reader) {
  /*make sure that length values that aren't filled in will be 0, or a wrong tree will be generated*/
  unsigned error = 0;
  unsigned n, HLIT, HDIST, HCLEN, i;

  /*see comments in deflateDynamic for explanation of the context and these variables, it is analogous*/
  unsigned* bitlen_ll = 0; /*lit,len code lengths*/
  unsigned* bitlen_d = 0; /*dist code lengths*/
  /*code length code lengths ("clcl"), the bit lengths of the huffman tree used to compress bitlen_ll and bitlen_d*/
  unsigned* bitlen_cl = 0;
  HuffmanTree tree_cl; /*the code tree for code length codes (the huffman tree for compressed huffman trees)*/

  if(!ensureBits17(reader, 14)) return 49; /*error: the bit pointer is or will go past the memory*/

  /*number of literal/length codes + 257. Unlike the spec, the value 257 is added to it here already*/
  HLIT =  readBits(reader, 5) + 257;
  /*number of distance codes. Unlike the spec, the value 1 is added to it here already*/
  HDIST = readBits(reader, 5) + 1;
  /*number of code length codes. Unlike the spec, the value 4 is added to it here already*/
  HCLEN = readBits(reader, 4) + 4;

  bitlen_cl = (unsigned*)lodepng_malloc(NUM_CODE_LENGTH_CODES * sizeof(unsigned));
  if(!bitlen_cl) return 83 /*alloc fail*/;

  HuffmanTree_init(&tree_cl);

  while(!error) {
    /*read the code length codes out of 3 * (amount of code length codes) bits*/
    if(lodepng_gtofl(reader->bp, HCLEN * 3, reader->bitsize)) {
      ERROR_BREAK(50); /*error: the bit pointer is or will go past the memory*/
    }
    for(i = 0; i != HCLEN; ++i) {
      ensureBits9(reader, 3); /*out of bounds already checked above */
      bitlen_cl[CLCL_ORDER[i]] = readBits(reader, 3);
    }
    for(i = HCLEN; i != NUM_CODE_LENGTH_CODES; ++i) {
      bitlen_cl[CLCL_ORDER[i]] = 0;
    }

    error = HuffmanTree_makeFromLengths(&tree_cl, bitlen_cl, NUM_CODE_LENGTH_CODES, 7);
    if(error) break;

    /*now we can use this tree to read the lengths for the tree that this function will return*/
    bitlen_ll = (unsigned*)lodepng_malloc(NUM_DEFLATE_CODE_SYMBOLS * sizeof(unsigned));
    bitlen_d = (unsigned*)lodepng_malloc(NUM_DISTANCE_SYMBOLS * sizeof(unsigned));
    if(!bitlen_ll || !bitlen_d) ERROR_BREAK(83 /*alloc fail*/);
    lodepng_memset(bitlen_ll, 0, NUM_DEFLATE_CODE_SYMBOLS * sizeof(*bitlen_ll));
    lodepng_memset(bitlen_d, 0, NUM_DISTANCE_SYMBOLS * sizeof(*bitlen_d));

    /*i is the current symbol we're reading in the part that contains the code lengths of lit/len and dist codes*/
    i = 0;
    while(i < HLIT + HDIST) {
      unsigned code;
      ensureBits25(reader, 22); /* up to 15 bits for huffman code, up to 7 extra bits below*/
      code = huffmanDecodeSymbol(reader, &tree_cl);
      if(code <= 15) /*a length code*/ {
        if(i < HLIT) bitlen_ll[i] = code;
        else bitlen_d[i - HLIT] = code;
        ++i;
      } else if(code == 16) /*repeat previous*/ {
        unsigned replength = 3; /*read in the 2 bits that indicate repeat length (3-6)*/
        unsigned value; /*set value to the previous code*/

        if(i == 0) ERROR_BREAK(54); /*can't repeat previous if i is 0*/

        replength += readBits(reader, 2);

        if(i < HLIT + 1) value = bitlen_ll[i - 1];
        else value = bitlen_d[i - HLIT - 1];
        /*repeat this value in the next lengths*/
        for(n = 0; n < replength; ++n) {
          if(i >= HLIT + HDIST) ERROR_BREAK(13); /*error: i is larger than the amount of codes*/
          if(i < HLIT) bitlen_ll[i] = value;
          else bitlen_d[i - HLIT] = value;
          ++i;
        }
      } else if(code == 17) /*repeat "0" 3-10 times*/ {
        unsigned replength = 3; /*read in the bits that indicate repeat length*/
        replength += readBits(reader, 3);

        /*repeat this value in the next lengths*/
        for(n = 0; n < replength; ++n) {
          if(i >= HLIT + HDIST) ERROR_BREAK(14); /*error: i is larger than the amount of codes*/

          if(i < HLIT) bitlen_ll[i] = 0;
          else bitlen_d[i - HLIT] = 0;
          ++i;
        }
      } else if(code == 18) /*repeat "0" 11-138 times*/ {
        unsigned replength = 11; /*read in the bits that indicate repeat length*/
        replength += readBits(reader, 7);

        /*repeat this value in the next lengths*/
        for(n = 0; n < replength; ++n) {
          if(i >= HLIT + HDIST) ERROR_BREAK(15); /*error: i is larger than the amount of codes*/

          if(i < HLIT) bitlen_ll[i] = 0;
          else bitlen_d[i - HLIT] = 0;
          ++i;
        }
      } else /*if(code == INVALIDSYMBOL)*/ {
        ERROR_BREAK(16); /*error: tried to read disallowed huffman symbol*/
      }
      /*check if any of the ensureBits above went out of bounds*/
      if(reader->bp > reader->bitsize) {
        /*return error code 10 or 11 depending on the situation that happened in huffmanDecodeSymbol
        (10=no endcode, 11=wrong jump outside of tree)*/
        /* TODO: revise error codes 10,11,50: the above comment is no longer valid */
        ERROR_BREAK(50); /*error, bit pointer jumps past memory*/
      }
    }
    if(error) break;

    if(bitlen_ll[256] == 0) ERROR_BREAK(64); /*the length of the end code 256 must be larger than 0*/

    /*now we've finally got HLIT and HDIST, so generate the code trees, and the function is done*/
    error = HuffmanTree_makeFromLengths(tree_ll, bitlen_ll, NUM_DEFLATE_CODE_SYMBOLS, 15);
    if(error) break;
    error = HuffmanTree_makeFromLengths(tree_d, bitlen_d, NUM_DISTANCE_SYMBOLS, 15);

    break; /*end of error-while*/
  }

  lodepng_free(bitlen_cl);
  lodepng_free(bitlen_ll);
  lodepng_free(bitlen_d);
  HuffmanTree_cleanup(&tree_cl);

  return error;
}